

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void chroma_check(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint y_sad,uint y_sad_g,
                 uint y_sad_alt,_Bool is_key_frame,_Bool zero_motion,uint *uv_sad)

{
  long lVar1;
  sbyte sVar2;
  BLOCK_SIZE BVar3;
  undefined4 uVar4;
  long lVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  YV12_BUFFER_CONFIG *pYVar8;
  scale_factors *psVar9;
  long lVar10;
  long lVar11;
  uint in_ECX;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long *in_RDI;
  uint in_R8D;
  uint in_R9D;
  byte in_stack_00000008;
  byte in_stack_00000010;
  long in_stack_00000018;
  uint8_t *src_2;
  uint8_t *src_1;
  uint8_t *src;
  BLOCK_SIZE bs;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int plane;
  uint uv_sad_alt;
  uint uv_sad_g;
  buf_2d dst;
  scale_factors *sf;
  YV12_BUFFER_CONFIG *yv12_alt;
  YV12_BUFFER_CONFIG *yv12_g;
  YV12_BUFFER_CONFIG *yv12;
  AV1_COMMON *cm;
  MB_MODE_INFO *mi;
  int fac_uv;
  int shift_lower_limit;
  int shift_upper_limit;
  int source_sad_nonrd;
  MACROBLOCKD *xd;
  MV_REFERENCE_FRAME in_stack_fffffffffffffecf;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int iVar12;
  undefined8 in_stack_fffffffffffffed8;
  MV_REFERENCE_FRAME ref_frame;
  int width;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  BLOCK_SIZE in_stack_fffffffffffffeef;
  uint in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  undefined8 local_108;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint uVar13;
  long lVar14;
  undefined8 in_stack_ffffffffffffff20;
  int local_ac;
  uint local_a8;
  uint local_a4;
  undefined8 local_a0;
  undefined4 local_88;
  uint local_50;
  sbyte local_4c;
  sbyte local_48;
  
  ref_frame = (MV_REFERENCE_FRAME)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  lVar5 = in_RSI + 0x1a0;
  iVar12 = *(int *)(in_RSI + 0x15d60);
  sVar2 = 1;
  local_48 = 1;
  local_4c = 3;
  local_50 = 6;
  if (((in_stack_00000008 & 1) == 0) && ((*(byte *)((long)in_RDI + 0x42444) & 1) == 0)) {
    if (*(int *)((long)in_RDI + 0x4269c) != 1) {
      if ((int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc) < 0x1fa400) {
        local_50 = 5;
      }
      else {
        local_50 = 3;
      }
    }
    if ((*(int *)((long)in_RDI + 0x4269c) == 1) && ((int)in_RDI[0xc0f6] != 0)) {
      local_4c = 7;
    }
    else if ((*(int *)((long)in_RDI + 0x4269c) == 1) &&
            (((0x5a < (int)in_RDI[0xc10a] && (10000 < (ulong)in_RDI[0xc0f9])) && (2 < iVar12)))) {
      local_4c = 8;
      local_48 = 3;
    }
    else {
      local_48 = sVar2;
      if (((2 < iVar12) && (500 < *(uint *)(in_RSI + 0x25640))) &&
         (0x383ff < (int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc))) {
        local_48 = 2;
        local_4c = 4;
        if (3 < iVar12) {
          local_4c = 5;
        }
      }
    }
    lVar1 = **(long **)(in_RSI + 0x2058);
    uVar13 = in_ECX;
    lVar14 = in_RSI;
    pYVar6 = get_ref_frame_yv12_buf
                       ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        ref_frame);
    pYVar7 = get_ref_frame_yv12_buf
                       ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        ref_frame);
    pYVar8 = get_ref_frame_yv12_buf
                       ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        ref_frame);
    psVar9 = get_ref_scale_factors_const
                       ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffecf);
    local_a4 = 0;
    local_a8 = 0;
    local_108 = in_stack_ffffffffffffff20;
    for (local_ac = 1; local_ac < 3; local_ac = local_ac + 1) {
      lVar10 = in_RSI + (long)local_ac * 0x88;
      lVar11 = in_RSI + 0x1b0 + (long)local_ac * 0xa30;
      BVar3 = get_plane_block_size(in_DL,*(int *)(lVar11 + 4),*(int *)(lVar11 + 8));
      if (BVar3 != BLOCK_INVALID) {
        iVar12 = (int)psVar9;
        width = (int)((ulong)psVar9 >> 0x20);
        if ((in_stack_00000010 & 1) == 0) {
          uVar4 = (**(code **)(*in_RDI + 0xc900 + (ulong)BVar3 * 0x70))
                            (*(undefined8 *)(lVar10 + 0x30),*(undefined4 *)(lVar10 + 0x48),
                             *(undefined8 *)(lVar11 + 0x10),*(undefined4 *)(lVar11 + 0x28));
          *(undefined4 *)(in_stack_00000018 + (long)(local_ac + -1) * 4) = uVar4;
        }
        else if (*(char *)(lVar1 + 0x10) == '\x01') {
          uVar4 = (**(code **)(*in_RDI + 0xc900 + (ulong)BVar3 * 0x70))
                            (*(undefined8 *)(lVar10 + 0x30),*(undefined4 *)(lVar10 + 0x48),
                             *(undefined8 *)(lVar11 + 0x30),*(undefined4 *)(lVar11 + 0x48));
          *(undefined4 *)(in_stack_00000018 + (long)(local_ac + -1) * 4) = uVar4;
        }
        else {
          if (local_ac == 1) {
            in_stack_ffffffffffffff08 = *(undefined8 *)((long)&pYVar6->field_5 + 8);
          }
          else {
            in_stack_ffffffffffffff08 = *(undefined8 *)((long)&pYVar6->field_5 + 0x10);
          }
          setup_pred_plane((buf_2d *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffeef,
                           (uint8_t *)
                           CONCAT44(in_stack_fffffffffffffee4,
                                    *(undefined4 *)(lVar5 + (long)local_ac * 0xa30 + 0x14)),width,
                           iVar12,in_stack_fffffffffffffed4,(int)in_stack_ffffffffffffff00,
                           (int)in_stack_ffffffffffffff08,
                           (scale_factors *)CONCAT44(uVar13,in_stack_ffffffffffffff10),(int)lVar14,
                           (int)local_108);
          uVar4 = (**(code **)(*in_RDI + 0xc900 + (ulong)BVar3 * 0x70))
                            (*(undefined8 *)(lVar10 + 0x30),*(undefined4 *)(lVar10 + 0x48),local_a0,
                             local_88);
          *(undefined4 *)(in_stack_00000018 + (long)(local_ac + -1) * 4) = uVar4;
        }
        if (in_R8D != 0xffffffff) {
          if (local_ac == 1) {
            in_stack_ffffffffffffff00 = *(undefined8 *)((long)&pYVar7->field_5 + 8);
          }
          else {
            in_stack_ffffffffffffff00 = *(undefined8 *)((long)&pYVar7->field_5 + 0x10);
          }
          setup_pred_plane((buf_2d *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffeef,
                           (uint8_t *)
                           CONCAT44(in_stack_fffffffffffffee4,
                                    *(undefined4 *)(lVar5 + (long)local_ac * 0xa30 + 0x14)),width,
                           iVar12,in_stack_fffffffffffffed4,(int)in_stack_ffffffffffffff00,
                           (int)in_stack_ffffffffffffff08,
                           (scale_factors *)CONCAT44(uVar13,in_stack_ffffffffffffff10),(int)lVar14,
                           (int)local_108);
          local_a4 = (**(code **)(*in_RDI + 0xc900 + (ulong)BVar3 * 0x70))
                               (*(undefined8 *)(lVar10 + 0x30),*(undefined4 *)(lVar10 + 0x48),
                                local_a0,local_88);
        }
        if (in_R9D != 0xffffffff) {
          if (local_ac == 1) {
            local_108 = *(undefined8 *)((long)&pYVar8->field_5 + 8);
          }
          else {
            local_108 = *(undefined8 *)((long)&pYVar8->field_5 + 0x10);
          }
          setup_pred_plane((buf_2d *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffeef,
                           (uint8_t *)
                           CONCAT44(in_stack_fffffffffffffee4,
                                    *(undefined4 *)(lVar5 + (long)local_ac * 0xa30 + 0x14)),width,
                           iVar12,in_stack_fffffffffffffed4,(int)in_stack_ffffffffffffff00,
                           (int)in_stack_ffffffffffffff08,
                           (scale_factors *)CONCAT44(uVar13,in_stack_ffffffffffffff10),(int)lVar14,
                           (int)local_108);
          local_a8 = (**(code **)(*in_RDI + 0xc900 + (ulong)BVar3 * 0x70))
                               (*(undefined8 *)(lVar10 + 0x30),*(undefined4 *)(lVar10 + 0x48),
                                local_a0,local_88);
        }
      }
      if (in_ECX >> local_48 < *(uint *)(in_stack_00000018 + (long)(local_ac + -1) * 4)) {
        *(undefined1 *)(in_RSI + 0x25620 + (long)(local_ac + -1)) = 1;
      }
      else if (*(uint *)(in_stack_00000018 + (long)(local_ac + -1) * 4) < in_ECX >> local_4c) {
        *(undefined1 *)(in_RSI + 0x25620 + (long)(local_ac + -1)) = 0;
      }
      else {
        *(undefined1 *)(in_RSI + 0x25620 + (long)(local_ac + -1)) = 2;
      }
      *(bool *)(in_RSI + 0x25622 + (long)(local_ac + -1)) = in_R8D / local_50 < local_a4;
      *(bool *)(in_RSI + 0x25624 + (long)(local_ac + -1)) = in_R9D / local_50 < local_a8;
      in_stack_fffffffffffffef0 = local_a4;
      in_stack_fffffffffffffef4 = local_a8;
    }
  }
  return;
}

Assistant:

static inline void chroma_check(AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                                unsigned int y_sad, unsigned int y_sad_g,
                                unsigned int y_sad_alt, bool is_key_frame,
                                bool zero_motion, unsigned int *uv_sad) {
  MACROBLOCKD *xd = &x->e_mbd;
  const int source_sad_nonrd = x->content_state_sb.source_sad_nonrd;
  int shift_upper_limit = 1;
  int shift_lower_limit = 3;
  int fac_uv = 6;
  if (is_key_frame || cpi->oxcf.tool_cfg.enable_monochrome) return;

  // Use lower threshold (more conservative in setting color flag) for
  // higher resolutions non-screen, which tend to have more camera noise.
  // Since this may be used to skip compound mode in nonrd pickmode, which
  // is generally more effective for higher resolutions, better to be more
  // conservative.
  if (cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN) {
    if (cpi->common.width * cpi->common.height >= RESOLUTION_1080P)
      fac_uv = 3;
    else
      fac_uv = 5;
  }
  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN &&
      cpi->rc.high_source_sad) {
    shift_lower_limit = 7;
  } else if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN &&
             cpi->rc.percent_blocks_with_motion > 90 &&
             cpi->rc.frame_source_sad > 10000 && source_sad_nonrd > kLowSad) {
    shift_lower_limit = 8;
    shift_upper_limit = 3;
  } else if (source_sad_nonrd >= kMedSad && x->source_variance > 500 &&
             cpi->common.width * cpi->common.height >= 640 * 360) {
    shift_upper_limit = 2;
    shift_lower_limit = source_sad_nonrd > kMedSad ? 5 : 4;
  }

  MB_MODE_INFO *mi = xd->mi[0];
  const AV1_COMMON *const cm = &cpi->common;
  const YV12_BUFFER_CONFIG *yv12 = get_ref_frame_yv12_buf(cm, LAST_FRAME);
  const YV12_BUFFER_CONFIG *yv12_g = get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
  const YV12_BUFFER_CONFIG *yv12_alt = get_ref_frame_yv12_buf(cm, ALTREF_FRAME);
  const struct scale_factors *const sf =
      get_ref_scale_factors_const(cm, LAST_FRAME);
  struct buf_2d dst;
  unsigned int uv_sad_g = 0;
  unsigned int uv_sad_alt = 0;

  for (int plane = AOM_PLANE_U; plane < MAX_MB_PLANE; ++plane) {
    struct macroblock_plane *p = &x->plane[plane];
    struct macroblockd_plane *pd = &xd->plane[plane];
    const BLOCK_SIZE bs =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);

    if (bs != BLOCK_INVALID) {
      // For last:
      if (zero_motion) {
        if (mi->ref_frame[0] == LAST_FRAME) {
          uv_sad[plane - 1] = cpi->ppi->fn_ptr[bs].sdf(
              p->src.buf, p->src.stride, pd->pre[0].buf, pd->pre[0].stride);
        } else {
          uint8_t *src = (plane == 1) ? yv12->u_buffer : yv12->v_buffer;
          setup_pred_plane(&dst, xd->mi[0]->bsize, src, yv12->uv_crop_width,
                           yv12->uv_crop_height, yv12->uv_stride, xd->mi_row,
                           xd->mi_col, sf, xd->plane[plane].subsampling_x,
                           xd->plane[plane].subsampling_y);

          uv_sad[plane - 1] = cpi->ppi->fn_ptr[bs].sdf(
              p->src.buf, p->src.stride, dst.buf, dst.stride);
        }
      } else {
        uv_sad[plane - 1] = cpi->ppi->fn_ptr[bs].sdf(
            p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride);
      }

      // For golden:
      if (y_sad_g != UINT_MAX) {
        uint8_t *src = (plane == 1) ? yv12_g->u_buffer : yv12_g->v_buffer;
        setup_pred_plane(&dst, xd->mi[0]->bsize, src, yv12_g->uv_crop_width,
                         yv12_g->uv_crop_height, yv12_g->uv_stride, xd->mi_row,
                         xd->mi_col, sf, xd->plane[plane].subsampling_x,
                         xd->plane[plane].subsampling_y);
        uv_sad_g = cpi->ppi->fn_ptr[bs].sdf(p->src.buf, p->src.stride, dst.buf,
                                            dst.stride);
      }

      // For altref:
      if (y_sad_alt != UINT_MAX) {
        uint8_t *src = (plane == 1) ? yv12_alt->u_buffer : yv12_alt->v_buffer;
        setup_pred_plane(&dst, xd->mi[0]->bsize, src, yv12_alt->uv_crop_width,
                         yv12_alt->uv_crop_height, yv12_alt->uv_stride,
                         xd->mi_row, xd->mi_col, sf,
                         xd->plane[plane].subsampling_x,
                         xd->plane[plane].subsampling_y);
        uv_sad_alt = cpi->ppi->fn_ptr[bs].sdf(p->src.buf, p->src.stride,
                                              dst.buf, dst.stride);
      }
    }

    if (uv_sad[plane - 1] > (y_sad >> shift_upper_limit))
      x->color_sensitivity_sb[COLOR_SENS_IDX(plane)] = 1;
    else if (uv_sad[plane - 1] < (y_sad >> shift_lower_limit))
      x->color_sensitivity_sb[COLOR_SENS_IDX(plane)] = 0;
    // Borderline case: to be refined at coding block level in nonrd_pickmode,
    // for coding block size < sb_size.
    else
      x->color_sensitivity_sb[COLOR_SENS_IDX(plane)] = 2;

    x->color_sensitivity_sb_g[COLOR_SENS_IDX(plane)] =
        uv_sad_g > y_sad_g / fac_uv;
    x->color_sensitivity_sb_alt[COLOR_SENS_IDX(plane)] =
        uv_sad_alt > y_sad_alt / fac_uv;
  }
}